

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O2

void __thiscall avro::Node::addName(Node *this,string *name)

{
  Name NStack_58;
  
  checkLock(this);
  Name::Name(&NStack_58,name);
  (*this->_vptr_Node[0x10])(this,&NStack_58);
  Name::~Name(&NStack_58);
  (*this->_vptr_Node[0x13])(this,name);
  return;
}

Assistant:

void addName(const std::string &name) {
        checkLock();
        checkName(name);
        doAddName(name);
    }